

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O0

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getc(kstream<gzFile_s_*,_FunctorZlib> *this,FILE *__stream)

{
  FunctorZlib *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((this->is_eof == 0) || (this->begin < this->end)) {
    if (this->end <= this->begin) {
      this->begin = 0;
      iVar1 = FunctorZlib::operator()
                        (unaff_retaddr,
                         (gzFile)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),this,
                         (uint)((ulong)this >> 0x20));
      this->end = iVar1;
      if ((uint)this->end < this->bufferSize) {
        this->is_eof = 1;
      }
      if (this->end == 0) {
        return -1;
      }
    }
    iVar1 = this->begin;
    this->begin = iVar1 + 1;
    iVar1 = (int)this->buf[iVar1];
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int getc()
    {
        if (this->is_eof && this->begin >= this->end)
            return -1;
        if (this->begin >= this->end)
        {
            this->begin = 0;
            this->end = this->readfunc(this->f, this->buf, bufferSize);
            if (this->end < bufferSize)
                this->is_eof = 1;
            if (this->end == 0)
                return -1;
        }
        return (int)this->buf[this->begin++];
    }